

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eh_personality.c
# Opt level: O2

void objc_end_catch(void)

{
  int *piVar1;
  int iVar2;
  void *__ptr;
  long lVar3;
  
  lVar3 = __tls_get_addr(&PTR_00129e08);
  piVar1 = (int *)(lVar3 + 0x48);
  iVar2 = *piVar1;
  if (iVar2 == 1) {
    __cxa_end_catch();
    *piVar1 = 2;
  }
  else if (iVar2 == 3) {
    (**(code **)(*(long *)(lVar3 + 0x50) + 8))(1);
    *piVar1 = 0;
    *(undefined8 *)(lVar3 + 0x50) = 0;
  }
  else if (iVar2 == 4) {
    *(undefined8 *)(lVar3 + 0x50) = 0;
    *piVar1 = 0;
  }
  else {
    __ptr = *(void **)(lVar3 + 0x50);
    if (__ptr == (void *)0x0) {
      __assert_fail("td->caughtExceptions != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/eh_personality.c"
                    ,0x2c3,"void objc_end_catch(void)");
    }
    iVar2 = *(int *)((long)__ptr + 0x18);
    if (iVar2 < 0) {
      *(int *)((long)__ptr + 0x18) = iVar2 + 1;
    }
    else {
      *(int *)((long)__ptr + 0x18) = iVar2 + -1;
      if (iVar2 + -1 == 0) {
        *(undefined8 *)(lVar3 + 0x50) = *(undefined8 *)((long)__ptr + 0x10);
        free(__ptr);
        return;
      }
    }
  }
  return;
}

Assistant:

OBJC_PUBLIC void objc_end_catch(void)
{
	struct thread_data *td = get_thread_data_fast();
	// If this is a boxed foreign exception then the boxing class is
	// responsible for cleaning it up
	if (td->current_exception_type == BOXED_FOREIGN)
	{
		td->caughtExceptions = 0;
		td->current_exception_type = NONE;
		return;
	}
	DEBUG_LOG("Ending catch\n");
	// If this is a C++ exception, then just let the C++ runtime handle it.
	if (td->current_exception_type == CXX)
	{
		__cxa_end_catch();
		td->current_exception_type = OBJC;
		return;
	}
	if (td->current_exception_type == FOREIGN)
	{
		struct _Unwind_Exception *e = ((struct _Unwind_Exception*)td->caughtExceptions);
		e->exception_cleanup(_URC_FOREIGN_EXCEPTION_CAUGHT, e);
		td->current_exception_type = NONE;
		td->caughtExceptions = 0;
		return;
	}
	// Otherwise we should do the cleanup thing.  Nested catches are possible,
	// so we only clean up the exception if this is the last reference.
	assert(td->caughtExceptions != 0);
	struct objc_exception *ex = td->caughtExceptions;
	// If this is being rethrown decrement its (negated) catch count, but don't
	// delete it even if its catch count would be 0.
	if (ex->catch_count < 0)
	{
		ex->catch_count++;
		return;
	}
	ex->catch_count--;
	if (ex->catch_count == 0)
	{
		td->caughtExceptions = ex->next;
		free(ex);
	}
}